

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGRSubgraphMining.cpp
# Opt level: O1

void dgrminer::find_addition_nodes_and_edges
               (AdjacencyListCrate *adjacency_list,
               vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
               *antecedent_pattern_edges_ADDED,
               vector<int,_std::allocator<int>_> *antecedent_pattern_node_id_ADDED,
               vector<int,_std::allocator<int>_> *antecedent_pattern_node_labels_ADDED,
               map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
               *from_pattern_id_to_adj_id_map,
               vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *adj_list_nodes,
               set<dgrminer::non_dummy_vertices_and_edges,_std::less<dgrminer::non_dummy_vertices_and_edges>,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
               *sets_of_used_edges,
               set<int,_std::less<int>,_std::allocator<int>_> *nodes_occupied_by_antecedent,
               set<int,_std::less<int>,_std::allocator<int>_> *edges_occupied_by_antecedent,
               bool debug)

{
  mapped_type mVar1;
  pointer piVar2;
  byte bVar3;
  pointer piVar4;
  mapped_type *pmVar5;
  pointer paVar6;
  _Base_ptr p_Var7;
  ulong uVar8;
  long lVar9;
  pointer piVar10;
  _Base_ptr p_Var11;
  _Rb_tree_header *p_Var12;
  _Rb_tree_header *p_Var13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  bool bVar17;
  bool bVar18;
  vector<bool,_std::allocator<bool>_> is_the_used_node_dummy;
  vector<int,_std::allocator<int>_> selected_ids_from_adj;
  vector<bool,_std::allocator<bool>_> adjacency_nodes_are_used;
  vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  maximal_set_of_edges;
  non_dummy_vertices_and_edges ndve;
  set<int,_std::less<int>,_std::allocator<int>_> set_of_non_dummy_vertices;
  vector<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>_>_>
  edge_mapping_sets;
  set<int,_std::less<int>,_std::allocator<int>_> set_of_used_edges;
  uint local_208;
  int local_204;
  vector<int,_std::allocator<int>_> local_1f8;
  vector<bool,_std::allocator<bool>_> local_1e0;
  vector<int,_std::allocator<int>_> local_1b8;
  ulong local_1a0;
  _Rb_tree_header *local_198;
  vector<bool,_std::allocator<bool>_> local_190;
  vector<int,_std::allocator<int>_> *local_168;
  vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  local_160;
  non_dummy_vertices_and_edges local_148;
  AdjacencyListCrate *local_e8;
  vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *local_e0;
  map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_> *local_d8;
  vector<int,_std::allocator<int>_> *local_d0;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_c8;
  vector<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>_>_>
  local_98;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_78;
  vector<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>_>_>
  local_48;
  
  local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_1e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_1e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  local_1e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_1e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  local_1e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_148.non_dummy_vertices._M_t._M_impl._0_4_ =
       local_148.non_dummy_vertices._M_t._M_impl._0_4_ & 0xffffff00;
  local_168 = antecedent_pattern_node_labels_ADDED;
  local_e8 = adjacency_list;
  local_e0 = antecedent_pattern_edges_ADDED;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_190,
             ((long)(adj_list_nodes->
                    super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(adj_list_nodes->
                    super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555,
             (bool *)&local_148,(allocator_type *)&local_c8);
  local_148.non_dummy_vertices._M_t._M_impl._0_4_ = 0;
  if (local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_1f8,
               (iterator)
               local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_148);
  }
  else {
    *local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 0;
    local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  p_Var13 = &(nodes_occupied_by_antecedent->_M_t)._M_impl.super__Rb_tree_header;
  local_1a0 = 0x800000000000003f;
  local_208 = 0;
  local_204 = 0;
  local_198 = p_Var13;
  local_d8 = from_pattern_id_to_adj_id_map;
  local_d0 = antecedent_pattern_node_id_ADDED;
  do {
    uVar15 = local_1a0;
    if ((ulong)((long)(local_168->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(local_168->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start >> 2) <= (ulong)(long)(int)local_208) {
      piVar4 = (antecedent_pattern_node_id_ADDED->super__Vector_base<int,_std::allocator<int>_>).
               _M_impl.super__Vector_impl_data._M_start;
      if ((antecedent_pattern_node_id_ADDED->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_finish != piVar4) {
        uVar8 = 0;
        do {
          mVar1 = local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar8];
          local_148.non_dummy_vertices._M_t._M_impl._0_1_ = (char)piVar4[uVar8];
          pmVar5 = std::
                   map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::
                   operator[](from_pattern_id_to_adj_id_map,(key_type_conflict *)&local_148);
          *pmVar5 = mVar1;
          uVar8 = uVar8 + 1;
          piVar4 = (antecedent_pattern_node_id_ADDED->super__Vector_base<int,_std::allocator<int>_>)
                   ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar8 < (ulong)((long)(antecedent_pattern_node_id_ADDED->
                                       super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                       super__Vector_impl_data._M_finish - (long)piVar4 >> 2));
      }
      local_98.
      super__Vector_base<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_98.
      super__Vector_base<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_98.
      super__Vector_base<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      find_addition_edges(local_e8,local_e0,from_pattern_id_to_adj_id_map,
                          (int)((ulong)((long)(adj_list_nodes->
                                              super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                                              )._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(adj_list_nodes->
                                             super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start) >> 2) *
                          -0x55555555,&local_98,edges_occupied_by_antecedent,debug);
      std::
      vector<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>_>_>
      ::vector(&local_48,&local_98);
      find_maximal_subsets_of_pairs(&local_160,&local_48);
      std::
      vector<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>_>_>
      ::~vector(&local_48);
      local_c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_c8._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_c8._M_impl.super__Rb_tree_header._M_header;
      local_c8._M_impl.super__Rb_tree_header._M_node_count = 0;
      piVar4 = (antecedent_pattern_node_id_ADDED->super__Vector_base<int,_std::allocator<int>_>).
               _M_impl.super__Vector_impl_data._M_start;
      local_c8._M_impl.super__Rb_tree_header._M_header._M_right =
           local_c8._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((antecedent_pattern_node_id_ADDED->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_finish != piVar4) {
        lVar9 = 0;
        uVar8 = 0;
        do {
          uVar16 = uVar8 + 0x3f;
          if (-1 < (long)uVar8) {
            uVar16 = uVar8;
          }
          if ((local_1e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
               ._M_start.super__Bit_iterator_base._M_p
               [((long)uVar16 >> 6) + ((ulong)((uVar8 & uVar15) < 0x8000000000000001) - 1)] >>
               (uVar8 & 0x3f) & 1) == 0) {
            std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique<int_const&>
                      ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                       &local_c8,(int *)((long)piVar4 + lVar9));
          }
          uVar8 = uVar8 + 1;
          piVar4 = (antecedent_pattern_node_id_ADDED->super__Vector_base<int,_std::allocator<int>_>)
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar9 = lVar9 + 4;
        } while (uVar8 < (ulong)((long)(antecedent_pattern_node_id_ADDED->
                                       super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                       super__Vector_impl_data._M_finish - (long)piVar4 >> 2));
      }
      if (local_160.
          super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_160.
          super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        uVar15 = 0;
        do {
          local_78._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_78._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_78._M_impl.super__Rb_tree_header._M_header;
          local_78._M_impl.super__Rb_tree_header._M_node_count = 0;
          piVar10 = local_160.
                    super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar15].
                    super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          local_78._M_impl.super__Rb_tree_header._M_header._M_right =
               local_78._M_impl.super__Rb_tree_header._M_header._M_left;
          if (local_160.
              super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar15].
              super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>._M_impl.
              super__Vector_impl_data._M_finish != piVar10) {
            lVar9 = 0;
            uVar8 = 0;
            do {
              std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
              _M_insert_unique<int_const&>
                        ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *
                         )&local_78,(int *)((long)&piVar10->first + lVar9));
              uVar8 = uVar8 + 1;
              piVar10 = local_160.
                        super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar15].
                        super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              lVar9 = lVar9 + 8;
            } while (uVar8 < (ulong)((long)local_160.
                                           super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[uVar15].
                                           super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)piVar10 >> 3));
          }
          local_148.non_dummy_vertices._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
               _S_red;
          local_148.non_dummy_vertices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)0x0;
          local_148.non_dummy_vertices._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_148.non_dummy_vertices._M_t._M_impl.super__Rb_tree_header._M_header;
          local_148.non_dummy_vertices._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_148.non_dummy_edges._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_148.non_dummy_edges._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)0x0;
          local_148.non_dummy_edges._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_148.non_dummy_edges._M_t._M_impl.super__Rb_tree_header._M_header;
          local_148.non_dummy_edges._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_148.non_dummy_vertices._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               local_148.non_dummy_vertices._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          local_148.non_dummy_edges._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               local_148.non_dummy_edges._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          operator=((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *
                    )&local_148,&local_c8);
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          operator=(&local_148.non_dummy_edges._M_t,&local_78);
          std::
          _Rb_tree<dgrminer::non_dummy_vertices_and_edges,dgrminer::non_dummy_vertices_and_edges,std::_Identity<dgrminer::non_dummy_vertices_and_edges>,std::less<dgrminer::non_dummy_vertices_and_edges>,std::allocator<dgrminer::non_dummy_vertices_and_edges>>
          ::_M_insert_unique<dgrminer::non_dummy_vertices_and_edges_const&>
                    ((_Rb_tree<dgrminer::non_dummy_vertices_and_edges,dgrminer::non_dummy_vertices_and_edges,std::_Identity<dgrminer::non_dummy_vertices_and_edges>,std::less<dgrminer::non_dummy_vertices_and_edges>,std::allocator<dgrminer::non_dummy_vertices_and_edges>>
                      *)sets_of_used_edges,&local_148);
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          ~_Rb_tree(&local_148.non_dummy_edges._M_t);
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          ~_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *
                    )&local_148);
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          ~_Rb_tree(&local_78);
          uVar15 = uVar15 + 1;
        } while (uVar15 < (ulong)(((long)local_160.
                                         super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_160.
                                         super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                 -0x5555555555555555));
      }
      p_Var13 = local_198;
      piVar4 = (antecedent_pattern_node_id_ADDED->super__Vector_base<int,_std::allocator<int>_>).
               _M_impl.super__Vector_impl_data._M_start;
      piVar2 = (antecedent_pattern_node_id_ADDED->super__Vector_base<int,_std::allocator<int>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      if (piVar2 != piVar4) {
        uVar15 = (ulong)local_1e0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset - 1;
        uVar8 = (ulong)local_1e0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset + 0x3e;
        if (-1 < (long)uVar15) {
          uVar8 = uVar15;
        }
        if ((local_1e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p
             [((long)uVar8 >> 6) + ((ulong)((uVar15 & local_1a0) < 0x8000000000000001) - 1)] >>
             (uVar15 & 0x3f) & 1) == 0) {
          uVar15 = (long)local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish[-2] - 1;
          uVar8 = (long)local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish[-2] + 0x3e;
          if (-1 < (long)uVar15) {
            uVar8 = uVar15;
          }
          bVar3 = (byte)uVar15 & 0x3f;
          local_190.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p
          [((long)uVar8 >> 6) + ((ulong)((uVar15 & local_1a0) < 0x8000000000000001) - 1)] =
               local_190.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
               ._M_start.super__Bit_iterator_base._M_p
               [((long)uVar8 >> 6) + ((ulong)((uVar15 & local_1a0) < 0x8000000000000001) - 1)] &
               (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
        }
        else {
          local_204 = local_204 + -1;
        }
        bVar17 = local_1e0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset == 0;
        local_1e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_offset =
             local_1e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_offset - 1;
        if (bVar17) {
          local_1e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset = 0x3f;
          local_1e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_p =
               local_1e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
               ._M_finish.super__Bit_iterator_base._M_p + -1;
        }
        local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + -1;
        local_208 = local_208 - 1;
        local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + -1;
      }
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&local_c8);
      std::
      vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
      ::~vector(&local_160);
      std::
      vector<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>_>_>
      ::~vector(&local_98);
      if (piVar2 == piVar4) break;
    }
    uVar8 = (ulong)local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[(int)local_208];
    paVar6 = (adj_list_nodes->
             super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    uVar15 = ((long)(adj_list_nodes->
                    super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)paVar6 >> 2) *
             -0x5555555555555555;
    bVar17 = true;
    if (uVar8 <= uVar15 && uVar15 - uVar8 != 0) {
      bVar17 = true;
      do {
        paVar6 = paVar6 + uVar8;
        p_Var11 = (nodes_occupied_by_antecedent->_M_t)._M_impl.super__Rb_tree_header._M_header.
                  _M_parent;
        p_Var7 = &p_Var13->_M_header;
        if (p_Var11 != (_Base_ptr)0x0) {
          do {
            if (paVar6->_M_elems[0] <= (int)*(size_t *)(p_Var11 + 1)) {
              p_Var7 = p_Var11;
            }
            p_Var11 = (&p_Var11->_M_left)[(int)*(size_t *)(p_Var11 + 1) < paVar6->_M_elems[0]];
          } while (p_Var11 != (_Base_ptr)0x0);
        }
        p_Var12 = p_Var13;
        if (((_Rb_tree_header *)p_Var7 != p_Var13) &&
           (p_Var12 = (_Rb_tree_header *)p_Var7,
           paVar6->_M_elems[0] < (int)((_Rb_tree_header *)p_Var7)->_M_node_count)) {
          p_Var12 = p_Var13;
        }
        uVar15 = uVar8 + 0x3f;
        if (-1 < (long)uVar8) {
          uVar15 = uVar8;
        }
        uVar16 = 1L << ((byte)uVar8 & 0x3f);
        bVar18 = true;
        if (p_Var12 == p_Var13) {
          uVar14 = (ulong)((uVar8 & local_1a0) < 0x8000000000000001);
          if ((local_190.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
               ._M_start.super__Bit_iterator_base._M_p[((long)uVar15 >> 6) + (uVar14 - 1)] & uVar16)
              == 0) {
            bVar18 = paVar6->_M_elems[2] !=
                     (local_168->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start[(int)local_208];
            if (!bVar18) {
              local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[(int)local_208] = (int)uVar8 + 1;
              local_148.non_dummy_vertices._M_t._M_impl._0_4_ = 0;
              if (local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (&local_1f8,
                           (iterator)
                           local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,(int *)&local_148);
              }
              else {
                *local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish = 0;
                local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              std::vector<bool,_std::allocator<bool>_>::push_back(&local_1e0,false);
              paVar6 = (adj_list_nodes->
                       super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + uVar8;
              if (local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)&local_1b8,
                           (iterator)
                           local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,paVar6->_M_elems);
              }
              else {
                *local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish = paVar6->_M_elems[0];
                local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              local_190.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p[((long)uVar15 >> 6) + (uVar14 - 1)] =
                   local_190.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                   [((long)uVar15 >> 6) + (uVar14 - 1)] | uVar16;
              local_208 = local_208 + 1;
              bVar17 = false;
            }
          }
        }
        p_Var13 = local_198;
        antecedent_pattern_node_id_ADDED = local_d0;
        if (!bVar18) break;
        uVar8 = uVar8 + 1;
        paVar6 = (adj_list_nodes->
                 super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        uVar15 = ((long)(adj_list_nodes->
                        super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)paVar6 >> 2) *
                 -0x5555555555555555;
      } while (uVar8 <= uVar15 && uVar15 - uVar8 != 0);
    }
    from_pattern_id_to_adj_id_map = local_d8;
    if (bVar17) {
      uVar15 = ((long)(adj_list_nodes->
                      super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(adj_list_nodes->
                      super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
      if ((ulong)(long)local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[(int)local_208] <= uVar15) {
        local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[(int)local_208] = (int)uVar15 + 1;
        local_148.non_dummy_vertices._M_t._M_impl._0_4_ = 0;
        if (local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_1f8,
                     (iterator)
                     local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)&local_148);
        }
        else {
          *local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = 0;
          local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        std::vector<bool,_std::allocator<bool>_>::push_back(&local_1e0,true);
        local_148.non_dummy_vertices._M_t._M_impl._0_4_ =
             (int)((ulong)((long)(adj_list_nodes->
                                 super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(adj_list_nodes->
                                super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555 +
             local_204;
        if (local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_1b8,
                     (iterator)
                     local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)&local_148);
        }
        else {
          *local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = local_148.non_dummy_vertices._M_t._M_impl._0_4_;
          local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        local_204 = local_204 + 1;
        local_208 = local_208 + 1;
      }
    }
    if ((0 < (int)local_208) &&
       ((ulong)(((long)(adj_list_nodes->
                       super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(adj_list_nodes->
                       super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                       )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555) <
        (ulong)(long)local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[local_208])) {
      uVar15 = (ulong)local_1e0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset - 1;
      uVar8 = (ulong)local_1e0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset + 0x3e;
      if (-1 < (long)uVar15) {
        uVar8 = uVar15;
      }
      if ((local_1e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_p
           [((long)uVar8 >> 6) + ((ulong)((uVar15 & local_1a0) < 0x8000000000000001) - 1)] >>
           (uVar15 & 0x3f) & 1) == 0) {
        uVar15 = (long)local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish[-2] - 1;
        uVar8 = (long)local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish[-2] + 0x3e;
        if (-1 < (long)uVar15) {
          uVar8 = uVar15;
        }
        bVar3 = (byte)uVar15 & 0x3f;
        local_190.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p
        [((long)uVar8 >> 6) + ((ulong)((uVar15 & local_1a0) < 0x8000000000000001) - 1)] =
             local_190.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p
             [((long)uVar8 >> 6) + ((ulong)((uVar15 & local_1a0) < 0x8000000000000001) - 1)] &
             (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
      }
      else {
        local_204 = local_204 + -1;
      }
      bVar17 = local_1e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
               ._M_finish.super__Bit_iterator_base._M_offset == 0;
      local_1e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset =
           local_1e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_offset - 1;
      if (bVar17) {
        local_1e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_offset = 0x3f;
        local_1e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p =
             local_1e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p + -1;
      }
      local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + -1;
      local_208 = local_208 - 1;
      local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + -1;
    }
  } while ((local_208 != 0) ||
          ((ulong)(long)*local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start <=
           (ulong)(((long)(adj_list_nodes->
                          super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(adj_list_nodes->
                          super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                          )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555)));
  if (local_190.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_190.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_190.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_190.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_190.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_190.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_190.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_1e0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_1e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_1e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_1e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_1e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_1e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void find_addition_nodes_and_edges(AdjacencyListCrate & adjacency_list, std::vector<std::array<int, PAT___SIZE>> & antecedent_pattern_edges_ADDED,
		std::vector<int> & antecedent_pattern_node_id_ADDED,
		std::vector<int> & antecedent_pattern_node_labels_ADDED,
		std::map<char, int> & from_pattern_id_to_adj_id_map,
		std::vector<std::array<int, ADJ_NODES___SIZE>> & adj_list_nodes,
		std::set<non_dummy_vertices_and_edges> & sets_of_used_edges,
		std::set<int> & nodes_occupied_by_antecedent, std::set<int> & edges_occupied_by_antecedent,
		bool debug)
	{
		// first, try to find the addition nodes:

		std::vector<int> selected_ids_from_adj; // which IDS of adj nodes correspond to those in antecedent_pattern_isolated_node_id
		std::vector<bool> is_the_used_node_dummy;
		std::vector<int> which_indices_should_be_used_next; // here we save the currently used indices for backtracking
		std::vector<bool> adjacency_nodes_are_used(adj_list_nodes.size(), false); // here we save which nodes from the adjacency list are already used

		int number_of_created_dummy_vertices = 0;

		int isolated_vertex_current_index_ADDED = 0; // we want to process the the first isolated vertex
		which_indices_should_be_used_next.push_back(0); // for the first isolated node, we want to start from the first node of adjacency list

		// DO DFS:
		while (true)
		{

			// if all isolated ADDITION nodes were mapped:
			if (antecedent_pattern_node_labels_ADDED.size() <= isolated_vertex_current_index_ADDED)
			{
				// we don't need to check whether there are no addition edges - we wouldn't get here from the outer function
				// process the addition edges:

				// CREATE MAPPING: PATTERN ANTECEDENT IDS -> selected_ids_from_adj
				for (size_t i = 0; i < antecedent_pattern_node_id_ADDED.size(); i++)
				{
					from_pattern_id_to_adj_id_map[antecedent_pattern_node_id_ADDED[i]] = selected_ids_from_adj[i];
				}
				// FINALLY, FIND MAPPING OF ADDITION EDGES:
				std::vector<std::set<int_pair>> edge_mapping_sets;
				find_addition_edges(adjacency_list, antecedent_pattern_edges_ADDED, from_pattern_id_to_adj_id_map,
					adj_list_nodes.size(), edge_mapping_sets, edges_occupied_by_antecedent, debug);

				std::vector<std::vector<int_pair>> maximal_set_of_edges = find_maximal_subsets_of_pairs(edge_mapping_sets);

				// get the set of non_dummy_vertices:
				std::set<int> set_of_non_dummy_vertices;
				for (size_t i = 0; i < antecedent_pattern_node_id_ADDED.size(); i++)
				{
					if (!is_the_used_node_dummy[i])
					{
						set_of_non_dummy_vertices.insert(antecedent_pattern_node_id_ADDED[i]);
					}
				}

				// SAVE the used pattern edges to a set
				for (size_t i = 0; i < maximal_set_of_edges.size(); i++)
				{
					std::set<int> set_of_used_edges;
					for (size_t j = 0; j < maximal_set_of_edges[i].size(); j++)
					{
						set_of_used_edges.insert(maximal_set_of_edges[i][j].first);
					}
					non_dummy_vertices_and_edges ndve;
					ndve.non_dummy_vertices = set_of_non_dummy_vertices;
					ndve.non_dummy_edges = set_of_used_edges;

					sets_of_used_edges.insert(ndve);
				}

				// if there were no ADDITION ISOLATED NODES, just finish the DFS:
				if (antecedent_pattern_node_id_ADDED.size() == 0) {
					break;
				}

				// else BACKTRACK:

				bool was_the_node_dummy = is_the_used_node_dummy.back();
				which_indices_should_be_used_next.pop_back();

				if (was_the_node_dummy)
				{
					number_of_created_dummy_vertices--;
				}
				else
				{
					adjacency_nodes_are_used[which_indices_should_be_used_next.back() - 1] = false;
				}
				is_the_used_node_dummy.pop_back();
				selected_ids_from_adj.pop_back();
				isolated_vertex_current_index_ADDED--;

			}
            // Nodes were not matched yet

			bool should_try_dummy = true;
			// try to find matching addition node:
			int node_candidate_index = which_indices_should_be_used_next[isolated_vertex_current_index_ADDED];
			for (; node_candidate_index < adj_list_nodes.size(); node_candidate_index++)
			{
				bool is_occupied_by_frequent_pattern = nodes_occupied_by_antecedent.find(adj_list_nodes[node_candidate_index][ADJ_NODES_ID]) != nodes_occupied_by_antecedent.end();
				// if the current adjacency node wasn't used yet:
				if (!adjacency_nodes_are_used[node_candidate_index] && !is_occupied_by_frequent_pattern)
				{
					// if it is same as that isolated vertex:
					// (we must take the antecedent info of both nodes)
					bool are_same = adj_list_nodes[node_candidate_index][ADJ_NODES_LABEL] == antecedent_pattern_node_labels_ADDED[isolated_vertex_current_index_ADDED];

					if (are_same)
					{
						//if (debug) cout << "Found node match: " << isolated_vertex_current_index_ADDED <<
						//	"-th addition vertex to adj. vertex with ID: " << adj_list_nodes[node_candidate_index][ADJ_NODES_ID] << endl;
						//cout << "DOING FINDING MATCHING: " << endl;

						should_try_dummy = false;
						which_indices_should_be_used_next[isolated_vertex_current_index_ADDED] = node_candidate_index + 1;
						which_indices_should_be_used_next.push_back(0);
						is_the_used_node_dummy.push_back(false);
						selected_ids_from_adj.push_back(adj_list_nodes[node_candidate_index][ADJ_NODES_ID]);

						adjacency_nodes_are_used[node_candidate_index] = true;
						isolated_vertex_current_index_ADDED++;
						break;
					}
				}
			}
			// if we tried all regular nodes and should backtrack, try to map to a dummy vertex first:
			if (should_try_dummy && which_indices_should_be_used_next[isolated_vertex_current_index_ADDED] <= adj_list_nodes.size())
			{
				//if (debug) cout << "Matching " << isolated_vertex_current_index_ADDED <<
				//	"-th addition vertex to a new dummy vertex with ID: " << (adj_list_nodes.size() + number_of_created_dummy_vertices) << endl;

				which_indices_should_be_used_next[isolated_vertex_current_index_ADDED] = adj_list_nodes.size() + 1; // just mark there the size + 1
				which_indices_should_be_used_next.push_back(0);
				is_the_used_node_dummy.push_back(true);
				// selected_ids_from_adj.push_back(adj_list_nodes[node_candidate_index][ADJ_NODES_ID]);
				//mark down the new ID of the dummy:
				//cout << "USING adj_list_nodes.size() = " << adj_list_nodes.size() << ", number_of_created_dummy_vertices = " << number_of_created_dummy_vertices << endl;

				selected_ids_from_adj.push_back(adj_list_nodes.size() + number_of_created_dummy_vertices);
				number_of_created_dummy_vertices++;
				isolated_vertex_current_index_ADDED++;
			}


			if (isolated_vertex_current_index_ADDED > 0 && which_indices_should_be_used_next[isolated_vertex_current_index_ADDED] > adj_list_nodes.size())
			{
				// BACKTRACK:
				// now we also tried the dummy one, so really backtrack

				bool was_the_node_dummy = is_the_used_node_dummy.back();

				which_indices_should_be_used_next.pop_back();
				if (was_the_node_dummy)
				{
					number_of_created_dummy_vertices--;
				}
				else
				{
					adjacency_nodes_are_used[which_indices_should_be_used_next.back() - 1] = false;
				}

				//cout << "DOING FINAL BACKTRACK: " << endl;

				is_the_used_node_dummy.pop_back();
				selected_ids_from_adj.pop_back();
				isolated_vertex_current_index_ADDED--;
			}

			if (isolated_vertex_current_index_ADDED == 0 && which_indices_should_be_used_next[isolated_vertex_current_index_ADDED] > adj_list_nodes.size())
			{
				// we tried all combinations, just end:
				break;
			}
		}
	}